

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *prop;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  reference ppVar4;
  reference pbVar5;
  ostream *poVar6;
  void *this_01;
  char *pcVar7;
  string local_14a8 [32];
  ostringstream local_1488 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1310 [32];
  ostringstream local_12f0 [8];
  ostringstream cmCTestLog_msg_8;
  string local_1178 [32];
  undefined1 local_1158 [8];
  ostringstream cmCTestLog_msg_7;
  string local_fe0 [32];
  undefined1 local_fc0 [8];
  ostringstream cmCTestLog_msg_6;
  string local_e48 [32];
  string local_e28 [36];
  int local_e04;
  undefined1 local_e00 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_c88 [8];
  ostringstream indexStr;
  string local_b10 [32];
  undefined1 local_af0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_978 [32];
  undefined1 local_958 [8];
  ostringstream cmCTestLog_msg_3;
  string local_7e0 [32];
  ostringstream local_7c0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_648 [32];
  undefined1 local_628 [8];
  ostringstream cmCTestLog_msg_1;
  string *label;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_470 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2e8 [8];
  cmCTestRunTest testRun;
  cmWorkingDirectory workdir;
  cmCTestTestProperties *p;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *it;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  cmCTestMultiProcessHandler *this_local;
  
  bVar2 = cmCTest::GetOutputAsJson(this->CTest);
  if (bVar2) {
    PrintOutputAsJson(this);
  }
  else {
    this_00 = this->TestHandler;
    iVar3 = FindMaxIndex(this);
    cmCTestTestHandler::SetMaxIndex(this_00,iVar3);
    __end1 = std::
             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ::begin(&(this->Properties).
                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    );
    it = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
         std::
         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
         ::end(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
    while( true ) {
      bVar2 = std::operator!=(&__end1,(_Self *)&it);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>
               ::operator*(&__end1);
      prop = ppVar4->second;
      cmWorkingDirectory::cmWorkingDirectory
                ((cmWorkingDirectory *)&testRun.TotalNumberOfTests,&prop->Directory);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_2e8,this);
      cmCTestRunTest::SetIndex((cmCTestRunTest *)local_2e8,prop->Index);
      cmCTestRunTest::SetTestProperties((cmCTestRunTest *)local_2e8,prop);
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2e8);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&prop->Labels);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
        std::operator<<((ostream *)local_470,"Labels:");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x517,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      }
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&prop->Labels);
      label = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&prop->Labels);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&label);
        if (!bVar2) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
        poVar6 = std::operator<<((ostream *)local_628," ");
        std::operator<<(poVar6,(string *)pbVar5);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x51b,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_648);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&prop->Labels);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_7c0);
        std::ostream::operator<<(local_7c0,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x520,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_7e0);
        std::__cxx11::ostringstream::~ostringstream(local_7c0);
      }
      if ((this->TestHandler->MemCheck & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af0);
        std::operator<<((ostream *)local_af0,"  Test");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x527,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_b10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_958);
        std::operator<<((ostream *)local_958,"  Memory Check");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x525,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_978);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_958);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c88);
      poVar6 = std::operator<<((ostream *)local_c88," #");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,prop->Index);
      std::operator<<(poVar6,":");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e00);
      iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
      iVar3 = getNumWidth((long)iVar3);
      local_e04 = (int)std::setw(iVar3 + 3);
      poVar6 = std::operator<<((ostream *)local_e00,(_Setw)local_e04);
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar6,local_e28);
      std::__cxx11::string::~string(local_e28);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x52f,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_e48);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fc0);
      poVar6 = std::operator<<((ostream *)local_fc0," ");
      std::operator<<(poVar6,(string *)prop);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x531,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_fe0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fc0);
      if ((prop->Disabled & 1U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1158);
        std::operator<<((ostream *)local_1158," (Disabled)");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x534,pcVar7,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_1178);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1158);
      }
      std::__cxx11::ostringstream::ostringstream(local_12f0);
      std::ostream::operator<<(local_12f0,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x536,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_1310);
      std::__cxx11::ostringstream::~ostringstream(local_12f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c88);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2e8);
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&testRun.TotalNumberOfTests);
      std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
      operator++(&__end1);
    }
    std::__cxx11::ostringstream::ostringstream(local_1488);
    poVar6 = (ostream *)std::ostream::operator<<(local_1488,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"Total Tests: ");
    this_01 = (void *)std::ostream::operator<<(poVar6,this->Total);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x53c,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_14a8);
    std::__cxx11::ostringstream::~ostringstream(local_1488);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}